

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O2

void __thiscall
writer_test_should_write_int_field_Test::TestBody(writer_test_should_write_int_field_Test *this)

{
  size_t __n;
  char *message;
  ostringstream local_1d8 [8];
  ostringstream oss;
  undefined8 local_60;
  undefined1 local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  internal local_30 [8];
  AssertionResult gtest_ar;
  
  local_60 = 0x19;
  local_58 = 0;
  std::__cxx11::ostringstream::ostringstream(local_1d8);
  Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<34U,_Fixpp::Type::Int>_>_>::write
            ((int)local_1d8,&local_60,__n);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
            (local_30,"oss.str()","\"34=25|\"",&local_50,(char (*) [7])"34=25|");
  std::__cxx11::string::~string((string *)&local_50);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
               ,0xc5,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  std::__cxx11::ostringstream::~ostringstream(local_1d8);
  return;
}

Assistant:

TEST(writer_test, should_write_int_field)
{
    using Field = Fixpp::Field<Fixpp::Tag::MsgSeqNum>;
    Field field;
    field.set(25);

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "34=25|");
}